

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# braille.hpp
# Opt level: O0

ostream * plot::detail::braille::operator<<(ostream *stream,line_t *line)

{
  difference_type __n;
  TerminalInfo *this;
  line_t *plVar1;
  bool bVar2;
  ostream *poVar3;
  pointer pbVar4;
  ansi_manip_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_&(*)(std::basic_ostream<char,_std::char_traits<char>_>_&)>
  aVar5;
  ansi_manip_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_&(*)(std::basic_ostream<char,_std::char_traits<char>_>_&)>
  local_a0;
  Color local_8c;
  Color local_7c;
  foreground_setter local_6c;
  __normal_iterator<const_plot::detail::braille::block_t_*,_std::vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>_>
  local_58;
  __normal_iterator<const_plot::detail::braille::block_t_*,_std::vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>_>
  end;
  const_iterator it;
  ansi_manip_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_&(*)(std::basic_ostream<char,_std::char_traits<char>_>_&)>
  local_38;
  TerminalInfo *local_28;
  TerminalInfo *term;
  BrailleCanvas *canvas;
  line_t *line_local;
  ostream *stream_local;
  
  term = (TerminalInfo *)line->canvas_;
  local_28 = &((BrailleCanvas *)term)->term_;
  canvas = (BrailleCanvas *)line;
  line_local = (line_t *)stream;
  aVar5 = TerminalInfo::reset(local_28);
  local_38.manip = aVar5.manip;
  local_38.mode = aVar5.mode;
  poVar3 = detail::operator<<(stream,&local_38);
  aVar5 = TerminalInfo::bold(local_28);
  it._M_current._0_4_ = aVar5.mode;
  detail::operator<<(poVar3,(ansi_manip_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_&(*)(std::basic_ostream<char,_std::char_traits<char>_>_&)>
                             *)&it);
  end._M_current = (block_t *)canvas->cols_;
  __n._0_4_ = (term->foreground_color).g;
  __n._4_4_ = (term->foreground_color).b;
  local_58 = __gnu_cxx::
             __normal_iterator<const_plot::detail::braille::block_t_*,_std::vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>_>
             ::operator+((__normal_iterator<const_plot::detail::braille::block_t_*,_std::vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>_>
                          *)&canvas->cols_,__n);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=(&end,&local_58);
    plVar1 = line_local;
    if (!bVar2) break;
    pbVar4 = __gnu_cxx::
             __normal_iterator<const_plot::detail::braille::block_t_*,_std::vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>_>
             ::operator->(&end);
    plVar1 = line_local;
    this = local_28;
    if (pbVar4->pixels == '\0') {
      std::operator<<((ostream *)line_local,' ');
    }
    else {
      pbVar4 = __gnu_cxx::
               __normal_iterator<const_plot::detail::braille::block_t_*,_std::vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>_>
               ::operator->(&end);
      local_8c = Color::over(&pbVar4->color,(Color *)&term[1].foreground_color.a);
      local_7c = Color::premultiplied(&local_8c);
      TerminalInfo::foreground(&local_6c,this,local_7c);
      poVar3 = detail::operator<<((ostream *)plVar1,&local_6c);
      poVar3 = std::operator<<(poVar3,-0x1e);
      pbVar4 = __gnu_cxx::
               __normal_iterator<const_plot::detail::braille::block_t_*,_std::vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>_>
               ::operator->(&end);
      poVar3 = std::operator<<(poVar3,(byte)((int)(pbVar4->pixels & 0xc0) >> 6) | 0xa0);
      pbVar4 = __gnu_cxx::
               __normal_iterator<const_plot::detail::braille::block_t_*,_std::vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>_>
               ::operator->(&end);
      std::operator<<(poVar3,pbVar4->pixels & 0x3f | 0x80);
    }
    __gnu_cxx::
    __normal_iterator<const_plot::detail::braille::block_t_*,_std::vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>_>
    ::operator++(&end);
  }
  aVar5 = TerminalInfo::reset(local_28);
  local_a0.manip = aVar5.manip;
  local_a0.mode = aVar5.mode;
  poVar3 = detail::operator<<((ostream *)plVar1,&local_a0);
  return poVar3;
}

Assistant:

std::ostream& operator<<(std::ostream& stream, line_t const& line) {
        auto const& canvas = *line.canvas_;
        auto const& term = canvas.term_;

        // Reset attributes + Bold mode
        // XXX: Empty dots in braille patterns are often rendered as empty
        // XXX: circles unless in bold mode.
        stream << term.reset() << term.bold();

        // Unicode braille patterns are 0x28xx
        // In binary:
        //   0b00101000'xxxxxxxx
        // In UTF-8:
        //   0b1110'0010, 0b10'1000'xx 0b10'xxxxxx

        for (auto it = line.it_, end = line.it_+canvas.cols_; it != end; ++it) {
            if (it->pixels) {
                stream << term.foreground(it->color.over(canvas.background_).premultiplied())
                       << char(0b1110'0010)
                       << char(0b10'1000'00 | ((it->pixels & 0b11'000000) >> 6))
                       << char(0b10'000000 | (it->pixels & 0b00'111111));
            } else {
                stream << ' ';
            }
        }

        return stream << term.reset();
    }